

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O3

void __thiscall crnlib::dds_comp::~dds_comp(dds_comp *this)

{
  qdxt_state *p;
  dxt_pixel_block *p_00;
  uchar *p_01;
  
  (this->super_itexture_comp)._vptr_itexture_comp = (_func_int **)&PTR__dds_comp_001d2958;
  p = this->m_pQDXT_state;
  if (p != (qdxt_state *)0x0) {
    p_00 = (p->m_pixel_blocks).m_p;
    if (p_00 != (dxt_pixel_block *)0x0) {
      crnlib_free(p_00);
    }
    qdxt5::~qdxt5(&p->m_qdxt5b);
    qdxt5::~qdxt5(&p->m_qdxt5a);
    qdxt1::~qdxt1(&p->m_qdxt1);
    crnlib_free(p);
  }
  task_pool::~task_pool(&this->m_task_pool);
  p_01 = (this->m_comp_data).m_p;
  if (p_01 != (uchar *)0x0) {
    crnlib_free(p_01);
  }
  mipmapped_texture::~mipmapped_texture(&this->m_packed_tex);
  mipmapped_texture::~mipmapped_texture(&this->m_src_tex);
  return;
}

Assistant:

dds_comp::~dds_comp()
    {
        crnlib_delete(m_pQDXT_state);
    }